

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_heap_scatter.cpp
# Opt level: O1

void duckdb::RowOperations::HeapScatter
               (Vector *v,idx_t vcount,SelectionVector *sel,idx_t ser_count,
               data_ptr_t *key_locations,optional_ptr<duckdb::NestedValidity,_true> parent_validity,
               idx_t offset)

{
  PhysicalType PVar1;
  data_ptr_t pdVar2;
  bool bVar3;
  uint uVar4;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  idx_t iVar5;
  reference this_00;
  type v_00;
  NotImplementedException *this_01;
  ulong uVar6;
  uint *puVar7;
  uint *puVar8;
  idx_t iVar9;
  size_type __n;
  UnifiedVectorFormat vdata_1;
  NestedValidity struct_validity;
  UnifiedVectorFormat vdata;
  optional_ptr<duckdb::NestedValidity,_true> local_40d8;
  idx_t local_40d0;
  UnifiedVectorFormat local_40c8;
  string local_4080;
  undefined1 local_4060 [40];
  undefined1 local_4038 [16];
  SelectionVector local_4028 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3ff8;
  
  bVar3 = TypeIsConstantSize((v->type).physical_type_);
  if (bVar3) {
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4038);
    Vector::ToUnifiedFormat(v,vcount,(UnifiedVectorFormat *)local_4038);
    HeapScatterVData((UnifiedVectorFormat *)local_4038,(v->type).physical_type_,sel,ser_count,
                     key_locations,parent_validity,offset);
  }
  else {
    PVar1 = (v->type).physical_type_;
    if (PVar1 < ARRAY) {
      if (PVar1 == LIST) {
        HeapScatterListVector(v,vcount,sel,ser_count,key_locations,parent_validity,offset);
        return;
      }
      local_40d0 = vcount;
      if (PVar1 != STRUCT) {
LAB_00ae1bcb:
        this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_4038._0_8_ = local_4028;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_4038,"Serialization of variable length vector with type %s","");
        LogicalType::ToString_abi_cxx11_(&local_4080,&v->type);
        NotImplementedException::NotImplementedException<std::__cxx11::string>
                  (this_01,(string *)local_4038,&local_4080);
        __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      local_40d8.ptr = parent_validity.ptr;
      UnifiedVectorFormat::UnifiedVectorFormat(&local_40c8);
      Vector::ToUnifiedFormat(v,local_40d0,&local_40c8);
      this = StructVector::GetEntries(v);
      if (ser_count != 0) {
        uVar6 = ((long)(this->
                       super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->
                       super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) + 7U >> 3;
        iVar9 = 0;
        do {
          pdVar2 = key_locations[iVar9];
          *(data_ptr_t *)(local_4038 + iVar9 * 8) = pdVar2;
          switchD_00570541::default(pdVar2,0xff,uVar6);
          key_locations[iVar9] = key_locations[iVar9] + uVar6;
          iVar5 = iVar9;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar5 = (idx_t)sel->sel_vector[iVar9];
          }
          if ((local_40c8.sel)->sel_vector != (sel_t *)0x0) {
            iVar5 = (idx_t)*(uint *)((long)(local_40c8.sel)->sel_vector + iVar5 * 4);
          }
          if (((local_40d8.ptr != (NestedValidity *)0x0) &&
              (local_40c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
               (unsigned_long *)0x0)) &&
             ((local_40c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [iVar5 + offset >> 6] >> (iVar5 + offset & 0x3f) & 1) == 0)) {
            optional_ptr<duckdb::NestedValidity,_true>::CheckValid(&local_40d8);
            NestedValidity::SetInvalid(local_40d8.ptr,iVar9);
          }
          iVar9 = iVar9 + 1;
        } while (ser_count != iVar9);
      }
      if ((this->
          super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ).
          super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->
          super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ).
          super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        __n = 0;
        do {
          this_00 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                    ::operator[](this,__n);
          v_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                           (this_00);
          NestedValidity::NestedValidity((NestedValidity *)local_4060,(data_ptr_t *)local_4038,__n);
          HeapScatter(v_00,local_40d0,sel,ser_count,key_locations,(NestedValidity *)local_4060,
                      offset);
          __n = __n + 1;
        } while (__n < (ulong)((long)(this->
                                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                     ).
                                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->
                                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                     ).
                                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      if (local_40c8.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40c8.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      goto LAB_00ae1810;
    }
    if (PVar1 == ARRAY) {
      HeapScatterArrayVector(v,vcount,sel,ser_count,key_locations,parent_validity,offset);
      return;
    }
    if (PVar1 != VARCHAR) goto LAB_00ae1bcb;
    local_40c8.sel = (SelectionVector *)parent_validity.ptr;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4038);
    Vector::ToUnifiedFormat(v,vcount,(UnifiedVectorFormat *)local_4038);
    if ((NestedValidity *)local_40c8.sel == (NestedValidity *)0x0) {
      if (ser_count != 0) {
        iVar9 = 0;
        do {
          iVar5 = iVar9;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar5 = (idx_t)sel->sel_vector[iVar9];
          }
          uVar6 = iVar5 + offset;
          if (*(long *)local_4038._0_8_ != 0) {
            uVar6 = (ulong)*(uint *)(*(long *)local_4038._0_8_ + uVar6 * 4);
          }
          if (((unsigned_long *)local_4028[0].sel_vector == (unsigned_long *)0x0) ||
             ((*(ulong *)((long)local_4028[0].sel_vector + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f) & 1)
              != 0)) {
            uVar4 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert
                              ((ulong)*(uint *)(local_4038._8_8_ + uVar6 * 0x10));
            puVar7 = (uint *)(local_4038._8_8_ + uVar6 * 0x10);
            *(uint *)key_locations[iVar9] = uVar4;
            pdVar2 = key_locations[iVar9];
            key_locations[iVar9] = pdVar2 + 4;
            if ((ulong)*puVar7 < 0xd) {
              puVar8 = puVar7 + 1;
            }
            else {
              puVar8 = *(uint **)(puVar7 + 2);
            }
            switchD_00b1522a::default(pdVar2 + 4,puVar8,(ulong)*puVar7);
            key_locations[iVar9] = key_locations[iVar9] + *puVar7;
          }
          iVar9 = iVar9 + 1;
        } while (ser_count != iVar9);
      }
    }
    else if (ser_count != 0) {
      iVar9 = 0;
      do {
        iVar5 = iVar9;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar5 = (idx_t)sel->sel_vector[iVar9];
        }
        uVar6 = iVar5 + offset;
        if (*(long *)local_4038._0_8_ != 0) {
          uVar6 = (ulong)*(uint *)(*(long *)local_4038._0_8_ + uVar6 * 4);
        }
        if (((unsigned_long *)local_4028[0].sel_vector == (unsigned_long *)0x0) ||
           ((*(ulong *)((long)local_4028[0].sel_vector + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f) & 1) !=
            0)) {
          uVar4 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert
                            ((ulong)*(uint *)(local_4038._8_8_ + uVar6 * 0x10));
          puVar7 = (uint *)(local_4038._8_8_ + uVar6 * 0x10);
          *(uint *)key_locations[iVar9] = uVar4;
          pdVar2 = key_locations[iVar9];
          key_locations[iVar9] = pdVar2 + 4;
          if ((ulong)*puVar7 < 0xd) {
            puVar8 = puVar7 + 1;
          }
          else {
            puVar8 = *(uint **)(puVar7 + 2);
          }
          switchD_00b1522a::default(pdVar2 + 4,puVar8,(ulong)*puVar7);
          key_locations[iVar9] = key_locations[iVar9] + *puVar7;
        }
        else {
          optional_ptr<duckdb::NestedValidity,_true>::CheckValid
                    ((optional_ptr<duckdb::NestedValidity,_true> *)&local_40c8);
          NestedValidity::SetInvalid((NestedValidity *)local_40c8.sel,iVar9);
        }
        iVar9 = iVar9 + 1;
      } while (ser_count != iVar9);
    }
  }
  local_40c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       local_4028[0].selection_data.internal.
       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_3ff8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3ff8._M_pi);
    local_40c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         local_4028[0].selection_data.internal.
         super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
LAB_00ae1810:
  if (local_40c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
               .
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void RowOperations::HeapScatter(Vector &v, idx_t vcount, const SelectionVector &sel, idx_t ser_count,
                                data_ptr_t *key_locations, optional_ptr<NestedValidity> parent_validity, idx_t offset) {
	if (TypeIsConstantSize(v.GetType().InternalType())) {
		UnifiedVectorFormat vdata;
		v.ToUnifiedFormat(vcount, vdata);
		RowOperations::HeapScatterVData(vdata, v.GetType().InternalType(), sel, ser_count, key_locations,
		                                parent_validity, offset);
	} else {
		switch (v.GetType().InternalType()) {
		case PhysicalType::VARCHAR:
			HeapScatterStringVector(v, vcount, sel, ser_count, key_locations, parent_validity, offset);
			break;
		case PhysicalType::STRUCT:
			HeapScatterStructVector(v, vcount, sel, ser_count, key_locations, parent_validity, offset);
			break;
		case PhysicalType::LIST:
			HeapScatterListVector(v, vcount, sel, ser_count, key_locations, parent_validity, offset);
			break;
		case PhysicalType::ARRAY:
			HeapScatterArrayVector(v, vcount, sel, ser_count, key_locations, parent_validity, offset);
			break;
		default:
			// LCOV_EXCL_START
			throw NotImplementedException("Serialization of variable length vector with type %s",
			                              v.GetType().ToString());
			// LCOV_EXCL_STOP
		}
	}
}